

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderTextureSizeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureSizeCase::deinit(TextureSizeCase *this)

{
  ShaderProgram *this_00;
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TextureSizeCase *this_local;
  
  if (this->m_texture != 0) {
    pRVar2 = Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x480))(1,&this->m_texture);
    this->m_texture = 0;
  }
  if (this->m_vbo != 0) {
    pRVar2 = Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x438))(1,&this->m_vbo);
    this->m_vbo = 0;
  }
  if (this->m_shader != (ShaderProgram *)0x0) {
    this_00 = this->m_shader;
    if (this_00 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(this_00);
      operator_delete(this_00,0xd0);
    }
    this->m_shader = (ShaderProgram *)0x0;
  }
  return;
}

Assistant:

void TextureSizeCase::deinit (void)
{
	if (m_texture)
	{
		m_context.getRenderContext().getFunctions().deleteTextures(1, &m_texture);
		m_texture = 0;
	}

	if (m_vbo)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_vbo);
		m_vbo = 0;
	}

	if (m_shader)
	{
		delete m_shader;
		m_shader = DE_NULL;
	}
}